

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
libcellml::Generator::GeneratorImpl::addImplementationVoiInfoCode(GeneratorImpl *this)

{
  shared_ptr<libcellml::ParentedEntity_const> *this_00;
  bool bVar1;
  uint uVar2;
  element_type *this_01;
  element_type *this_02;
  element_type *this_03;
  element_type *peVar3;
  byte local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string type;
  shared_ptr<libcellml::Component> local_130;
  undefined1 local_120 [8];
  string component;
  undefined1 local_f0 [8];
  string units;
  string name;
  undefined1 local_a0 [8];
  VariablePtr voiVariable;
  string local_88;
  byte local_65;
  string local_58;
  byte local_31;
  string local_30;
  GeneratorImpl *local_10;
  GeneratorImpl *this_local;
  
  local_10 = this;
  bVar1 = modelHasOdes(this);
  local_31 = 0;
  local_65 = 0;
  voiVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  local_229 = 0;
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::implementationVoiInfoString_abi_cxx11_(&local_30,peVar3);
    local_31 = 1;
    uVar2 = std::__cxx11::string::empty();
    local_229 = 0;
    if ((uVar2 & 1) == 0) {
      peVar3 = std::
               __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->mProfile);
      GeneratorProfile::variableInfoEntryString_abi_cxx11_(&local_58,peVar3);
      local_65 = 1;
      uVar2 = std::__cxx11::string::empty();
      local_229 = 0;
      if ((uVar2 & 1) == 0) {
        peVar3 = std::
                 __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mProfile);
        GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_(&local_88,peVar3);
        voiVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._7_1_ = 1;
        local_229 = std::__cxx11::string::empty();
        local_229 = local_229 ^ 0xff;
      }
    }
  }
  if ((voiVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._7_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((local_65 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_31 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((local_229 & 1) != 0) {
    std::__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    AnalyserModel::voi((AnalyserModel *)(name.field_2._M_local_buf + 8));
    std::__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)(name.field_2._M_local_buf + 8));
    AnalyserVariable::variable((AnalyserVariable *)local_a0);
    std::shared_ptr<libcellml::AnalyserVariable>::~shared_ptr
              ((shared_ptr<libcellml::AnalyserVariable> *)((long)&name.field_2 + 8));
    this_01 = std::
              __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_a0);
    NamedEntity::name_abi_cxx11_((string *)((long)&units.field_2 + 8),&this_01->super_NamedEntity);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )local_a0);
    Variable::units((Variable *)((long)&component.field_2 + 8));
    this_02 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(component.field_2._M_local_buf + 8));
    NamedEntity::name_abi_cxx11_((string *)local_f0,&this_02->super_NamedEntity);
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)((long)&component.field_2 + 8));
    this_00 = (shared_ptr<libcellml::ParentedEntity_const> *)((long)&type.field_2 + 8);
    std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
              (this_00,(shared_ptr<libcellml::Variable> *)local_a0);
    owningComponent((libcellml *)&local_130,(ParentedEntityConstPtr *)this_00);
    this_03 = std::
              __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_130);
    NamedEntity::name_abi_cxx11_((string *)local_120,(NamedEntity *)this_03);
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_130);
    std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<const_libcellml::ParentedEntity> *)((long)&type.field_2 + 8));
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_((string *)local_160,peVar3)
    ;
    newLineIfNeeded_abi_cxx11_(&local_1a0,this);
    peVar3 = std::
             __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mProfile);
    GeneratorProfile::implementationVoiInfoString_abi_cxx11_(&local_1e0,peVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"[CODE]",&local_201);
    generateVariableInfoEntryCode
              (&local_228,this,(string *)((long)&units.field_2 + 8),(string *)local_f0,
               (string *)local_120,(string *)local_160);
    replace(&local_1c0,&local_1e0,&local_200,&local_228);
    std::operator+(&local_180,&local_1a0,&local_1c0);
    std::__cxx11::string::operator+=((string *)&this->mCode,(string *)&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)(units.field_2._M_local_buf + 8));
    std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_a0);
  }
  return;
}

Assistant:

void Generator::GeneratorImpl::addImplementationVoiInfoCode()
{
    if (modelHasOdes()
        && !mProfile->implementationVoiInfoString().empty()
        && !mProfile->variableInfoEntryString().empty()
        && !mProfile->variableOfIntegrationVariableTypeString().empty()) {
        auto voiVariable = mModel->voi()->variable();
        auto name = voiVariable->name();
        auto units = voiVariable->units()->name();
        auto component = owningComponent(voiVariable)->name();
        auto type = mProfile->variableOfIntegrationVariableTypeString();

        mCode += newLineIfNeeded()
                 + replace(mProfile->implementationVoiInfoString(),
                           "[CODE]", generateVariableInfoEntryCode(name, units, component, type));
    }
}